

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<std::basic_string_view<char,std::char_traits<char>>const&>,std::tuple<>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           *this,iterator iter,piecewise_construct_t *args,
          tuple<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *args_1,
          tuple<> *args_2)

{
  size_t c;
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  char *pcVar2;
  bool bVar3;
  reference key;
  iterator local_48;
  iterator local_38;
  iterator local_20;
  
  local_38.field_1 = iter.field_1;
  local_38.ctrl_ = iter.ctrl_;
  c = *(size_t *)this;
  *(undefined8 *)this = 0xffffffffffffff9c;
  pbVar1 = (args_1->
           super__Tuple_impl<0UL,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>).
           super__Head_base<0UL,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_false>
           ._M_head_impl;
  pcVar2 = pbVar1->_M_str;
  *(size_t *)local_38.field_1.slot_ = pbVar1->_M_len;
  *(char **)((long)local_38.field_1.slot_ + 8) = pcVar2;
  *(size_t **)((long)local_38.field_1.slot_ + 0x10) =
       (size_t *)((long)local_38.field_1.slot_ + 0x20);
  *(size_t *)((long)local_38.field_1.slot_ + 0x18) = 0;
  *(undefined1 *)((long)local_38.field_1.slot_ + 0x20) = 0;
  CommonFields::set_capacity((CommonFields *)this,c);
  key = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::iterator::operator*(&local_38);
  local_20 = find<std::basic_string_view<char,std::char_traits<char>>>(this,&key->first);
  local_48.ctrl_ = local_38.ctrl_;
  local_48.field_1.slot_ = (slot_type *)local_38.field_1;
  bVar3 = container_internal::operator==(&local_20,&local_48);
  if (bVar3) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xfe2,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string<char>>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string<char>>>, Args = <const std::piecewise_construct_t &, std::tuple<const std::basic_string_view<char> &>, std::tuple<>>]"
               );
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }